

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::CompressionParameters> *
kj::_::tryParseAllExtensionOffers
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers,
          CompressionParameters *manualConfig)

{
  bool bVar1;
  ArrayPtr<const_char> *pAVar2;
  ArrayPtr<const_char> *this;
  NullableValue<kj::CompressionParameters> *pNVar3;
  CompressionParameters *pCVar4;
  CompressionParameters *pCVar5;
  char in_R8B;
  ArrayPtr<const_char> AVar6;
  ArrayPtr<const_char> input;
  CompressionParameters *finalConfig;
  CompressionParameters local_1d0;
  Maybe<kj::CompressionParameters> local_1a8;
  undefined1 local_178 [8];
  NullableValue<kj::CompressionParameters> _finalConfig5167;
  CompressionParameters *config;
  undefined1 local_110 [8];
  NullableValue<kj::CompressionParameters> _config5166;
  ArrayPtr<const_char> local_d8;
  ArrayPtr<const_char> local_c8;
  _ *local_b8;
  char *pcStack_b0;
  undefined1 local_a8 [8];
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  ArrayPtr<const_char> *offer;
  ArrayPtr<const_char> *__end2;
  ArrayPtr<const_char> *local_68;
  ArrayPtr<const_char> *__begin2;
  Vector<kj::ArrayPtr<const_char>_> *__range2;
  char *local_50;
  undefined1 local_48 [8];
  Vector<kj::ArrayPtr<const_char>_> splitOffers;
  CompressionParameters *manualConfig_local;
  StringPtr offers_local;
  
  offers_local.content.ptr = (char *)offers.content.size_;
  manualConfig_local = (CompressionParameters *)offers.content.ptr;
  splitOffers.builder.disposer = (ArrayDisposer *)manualConfig;
  offers_local.content.size_ = (size_t)__return_storage_ptr__;
  AVar6 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&manualConfig_local);
  __range2 = (Vector<kj::ArrayPtr<const_char>_> *)AVar6.ptr;
  local_50 = (char *)AVar6.size_;
  AVar6.size_ = 0x2c;
  AVar6.ptr = local_50;
  splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_48,(_ *)__range2,AVar6,in_R8B);
  local_68 = Vector<kj::ArrayPtr<const_char>_>::begin((Vector<kj::ArrayPtr<const_char>_> *)local_48)
  ;
  pAVar2 = Vector<kj::ArrayPtr<const_char>_>::end((Vector<kj::ArrayPtr<const_char>_> *)local_48);
  for (; local_68 != pAVar2; local_68 = local_68 + 1) {
    splitOffer.builder.disposer = (ArrayDisposer *)local_68;
    local_b8 = (_ *)local_68->ptr;
    pcStack_b0 = (char *)local_68->size_;
    input.size_ = 0x3b;
    input.ptr = pcStack_b0;
    splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_a8,local_b8,input,in_R8B);
    this = Vector<kj::ArrayPtr<const_char>_>::front((Vector<kj::ArrayPtr<const_char>_> *)local_a8);
    AVar6 = (ArrayPtr<const_char>)operator____kj("permessage-deflate",0x12);
    local_d8 = AVar6;
    AVar6 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_d8);
    local_c8 = AVar6;
    bVar1 = ArrayPtr<const_char>::operator==(this,&local_c8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tryExtractParameters
                ((Maybe<kj::CompressionParameters> *)&config,
                 (Vector<kj::ArrayPtr<const_char>_> *)local_a8,false);
      pNVar3 = readMaybe<kj::CompressionParameters>((Maybe<kj::CompressionParameters> *)&config);
      NullableValue<kj::CompressionParameters>::NullableValue
                ((NullableValue<kj::CompressionParameters> *)local_110,pNVar3);
      Maybe<kj::CompressionParameters>::~Maybe((Maybe<kj::CompressionParameters> *)&config);
      pCVar4 = NullableValue::operator_cast_to_CompressionParameters_((NullableValue *)local_110);
      if (pCVar4 == (CompressionParameters *)0x0) {
LAB_0070a68e:
        _config5166.field_1._36_4_ = 0;
      }
      else {
        _finalConfig5167.field_1.value.inboundMaxWindowBits.ptr.field_1 =
             (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
             NullableValue<kj::CompressionParameters>::operator*
                       ((NullableValue<kj::CompressionParameters> *)local_110);
        CompressionParameters::CompressionParameters
                  (&local_1d0,
                   (CompressionParameters *)
                   _finalConfig5167.field_1.value.inboundMaxWindowBits.ptr.field_1);
        CompressionParameters::CompressionParameters
                  ((CompressionParameters *)&finalConfig,manualConfig);
        compareClientAndServerConfigs(&local_1a8,&local_1d0,(CompressionParameters *)&finalConfig);
        pNVar3 = readMaybe<kj::CompressionParameters>(&local_1a8);
        NullableValue<kj::CompressionParameters>::NullableValue
                  ((NullableValue<kj::CompressionParameters> *)local_178,pNVar3);
        Maybe<kj::CompressionParameters>::~Maybe(&local_1a8);
        CompressionParameters::~CompressionParameters((CompressionParameters *)&finalConfig);
        CompressionParameters::~CompressionParameters(&local_1d0);
        pCVar4 = NullableValue::operator_cast_to_CompressionParameters_((NullableValue *)local_178);
        if (pCVar4 != (CompressionParameters *)0x0) {
          pCVar5 = NullableValue<kj::CompressionParameters>::operator*
                             ((NullableValue<kj::CompressionParameters> *)local_178);
          pCVar5 = mv<kj::CompressionParameters>(pCVar5);
          Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__,pCVar5);
        }
        _config5166.field_1._37_3_ = 0;
        _config5166.field_1._36_1_ = pCVar4 != (CompressionParameters *)0x0;
        NullableValue<kj::CompressionParameters>::~NullableValue
                  ((NullableValue<kj::CompressionParameters> *)local_178);
        if (_config5166.field_1._36_4_ == 0) goto LAB_0070a68e;
      }
      NullableValue<kj::CompressionParameters>::~NullableValue
                ((NullableValue<kj::CompressionParameters> *)local_110);
      if (_config5166.field_1._36_4_ == 0) {
        _config5166.field_1._36_4_ = 0;
      }
    }
    else {
      _config5166.field_1._36_4_ = 3;
    }
    Vector<kj::ArrayPtr<const_char>_>::~Vector((Vector<kj::ArrayPtr<const_char>_> *)local_a8);
    if ((_config5166.field_1._36_4_ != 0) && (_config5166.field_1._36_4_ != 3)) goto LAB_0070a72e;
  }
  Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__);
  _config5166.field_1._36_4_ = 1;
LAB_0070a72e:
  Vector<kj::ArrayPtr<const_char>_>::~Vector((Vector<kj::ArrayPtr<const_char>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> tryParseAllExtensionOffers(StringPtr offers,
    CompressionParameters manualConfig) {
  // Similar to `tryParseExtensionOffers()`, however, this function is called when parsing in
  // `MANUAL_COMPRESSION` mode. In some cases, the server's configuration might not support the
  // `server_no_context_takeover` or `server_max_window_bits` parameters. Essentially, this function
  // will look at all the client's offers, and accept the first one that it can support.
  //
  // We differentiate these functions because in `AUTOMATIC_COMPRESSION` mode, KJ can support these
  // server restricting compression parameters.
  auto splitOffers = splitParts(offers, ',');

  for (const auto& offer : splitOffers) {
    auto splitOffer = splitParts(offer, ';');

    if (splitOffer.front() != "permessage-deflate"_kj) {
      // Extension token was invalid.
      continue;
    }
    KJ_IF_SOME(config, tryExtractParameters(splitOffer, false)) {
      KJ_IF_SOME(finalConfig, compareClientAndServerConfigs(config, manualConfig)) {
        // Found a compatible configuration between the server's config and client's offer.
        return kj::mv(finalConfig);
      }
    }
  }
  return kj::none;
}